

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib507.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  timeval tVar11;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar9 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar9,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                  ,0x29,iVar1,uVar3);
    goto LAB_00102498;
  }
  lVar4 = curl_multi_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                  ,0x2b);
    iVar1 = -1;
    iVar2 = 0x7b;
  }
  else {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      lVar5 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                    ,0x2d);
      iVar1 = -1;
      iVar2 = 0x7c;
    }
    else {
      iVar2 = curl_easy_setopt(lVar5,0x2712,URL);
      uVar9 = _stderr;
      if (iVar2 == 0) {
        iVar2 = curl_easy_setopt(lVar5,0x2a,1);
        uVar9 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uVar8 = 0x30;
          goto LAB_0010246a;
        }
        iVar2 = curl_multi_add_handle(lVar4,lVar5);
        uVar9 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar10 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uVar8 = 0x32;
          goto LAB_0010246a;
        }
        iVar2 = curl_multi_perform(lVar4,&local_1d0);
        uVar9 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar10 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uVar8 = 0x34;
          goto LAB_0010246a;
        }
        if (local_1d0 < 0) {
          curl_mfprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                        ,0x34);
          iVar1 = -1;
          iVar2 = 0x7a;
          goto LAB_0010247d;
        }
        tVar11 = tutil_tvnow();
        lVar6 = tutil_tvdiff(tVar11,tv_test_start);
        if (60000 < lVar6) {
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                        ,0x36);
          iVar1 = -1;
          iVar2 = 0x7d;
          goto LAB_0010247d;
        }
        if (local_1d0 != 0) {
          do {
            local_1cc = -99;
            local_1b8.__fds_bits[0] = 0;
            local_1b8.__fds_bits[1] = 0;
            local_1b8.__fds_bits[2] = 0;
            local_1b8.__fds_bits[3] = 0;
            local_1b8.__fds_bits[4] = 0;
            local_1b8.__fds_bits[5] = 0;
            local_1b8.__fds_bits[6] = 0;
            local_1b8.__fds_bits[7] = 0;
            local_1b8.__fds_bits[8] = 0;
            local_1b8.__fds_bits[9] = 0;
            local_1b8.__fds_bits[10] = 0;
            local_1b8.__fds_bits[0xb] = 0;
            local_1b8.__fds_bits[0xc] = 0;
            local_1b8.__fds_bits[0xd] = 0;
            local_1b8.__fds_bits[0xe] = 0;
            local_1b8.__fds_bits[0xf] = 0;
            local_b8.__fds_bits[0] = 0;
            local_b8.__fds_bits[1] = 0;
            local_b8.__fds_bits[2] = 0;
            local_b8.__fds_bits[3] = 0;
            local_b8.__fds_bits[4] = 0;
            local_b8.__fds_bits[5] = 0;
            local_b8.__fds_bits[6] = 0;
            local_b8.__fds_bits[7] = 0;
            local_b8.__fds_bits[8] = 0;
            local_b8.__fds_bits[9] = 0;
            local_b8.__fds_bits[10] = 0;
            local_b8.__fds_bits[0xb] = 0;
            local_b8.__fds_bits[0xc] = 0;
            local_b8.__fds_bits[0xd] = 0;
            local_b8.__fds_bits[0xe] = 0;
            local_b8.__fds_bits[0xf] = 0;
            local_138.__fds_bits[0xe] = 0;
            local_138.__fds_bits[0xf] = 0;
            local_138.__fds_bits[0xc] = 0;
            local_138.__fds_bits[0xd] = 0;
            local_138.__fds_bits[10] = 0;
            local_138.__fds_bits[0xb] = 0;
            local_138.__fds_bits[8] = 0;
            local_138.__fds_bits[9] = 0;
            local_138.__fds_bits[6] = 0;
            local_138.__fds_bits[7] = 0;
            local_138.__fds_bits[4] = 0;
            local_138.__fds_bits[5] = 0;
            local_138.__fds_bits[2] = 0;
            local_138.__fds_bits[3] = 0;
            local_138.__fds_bits[0] = 0;
            local_138.__fds_bits[1] = 0;
            local_1c8.tv_sec = 1;
            local_1c8.tv_usec = 0;
            iVar2 = curl_multi_fdset(lVar4,&local_1b8,&local_b8,&local_138,&local_1cc);
            uVar9 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_multi_strerror(iVar2);
              pcVar10 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
              uVar8 = 0x45;
              goto LAB_0010246a;
            }
            if (local_1cc < -1) {
              pcVar10 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar9 = 0x45;
LAB_0010281f:
              curl_mfprintf(_stderr,pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                            ,uVar9);
              iVar2 = 0x7a;
              goto LAB_00102477;
            }
            iVar1 = select_wrapper(local_1cc + 1,&local_1b8,&local_b8,&local_138,&local_1c8);
            if (iVar1 == -1) {
              piVar7 = __errno_location();
              uVar9 = _stderr;
              iVar1 = *piVar7;
              pcVar10 = strerror(iVar1);
              curl_mfprintf(uVar9,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                            ,0x49,iVar1,pcVar10);
              iVar2 = 0x79;
              goto LAB_00102477;
            }
            tVar11 = tutil_tvnow();
            lVar6 = tutil_tvdiff(tVar11,tv_test_start);
            if (60000 < lVar6) {
              uVar9 = 0x4b;
LAB_0010284d:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                            ,uVar9);
              iVar2 = 0x7d;
              goto LAB_00102477;
            }
            iVar2 = curl_multi_perform(lVar4,&local_1d0);
            uVar9 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_multi_strerror(iVar2);
              pcVar10 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uVar8 = 0x4d;
              goto LAB_0010246a;
            }
            if (local_1d0 < 0) {
              pcVar10 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar9 = 0x4d;
              goto LAB_0010281f;
            }
            tVar11 = tutil_tvnow();
            lVar6 = tutil_tvdiff(tVar11,tv_test_start);
            if (60000 < lVar6) {
              uVar9 = 0x4f;
              goto LAB_0010284d;
            }
          } while (local_1d0 != 0);
        }
        lVar6 = curl_multi_info_read(lVar4,&local_1d0);
        iVar2 = 0;
        if (lVar6 != 0) {
          iVar1 = *(int *)(lVar6 + 0x10);
          goto LAB_0010247d;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar2);
        pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar8 = 0x2f;
LAB_0010246a:
        curl_mfprintf(uVar9,pcVar10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                      ,uVar8,iVar2,uVar3);
      }
LAB_00102477:
      iVar1 = -1;
    }
  }
LAB_0010247d:
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
  if (iVar2 != 0) {
    iVar1 = iVar2;
  }
LAB_00102498:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = -1;
  int res = 0;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}